

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

void composition_solid_destination_over
               (uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  uint uVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (const_alpha != 0xff) {
    color = BYTE_MUL(color,const_alpha);
  }
  uVar4 = 0;
  uVar3 = (ulong)(uint)length;
  if (length < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = dest[uVar4];
    uVar2 = BYTE_MUL(color,~uVar1 >> 0x18);
    dest[uVar4] = uVar2 + uVar1;
  }
  return;
}

Assistant:

static void composition_solid_destination_over(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha != 255)
        color = BYTE_MUL(color, const_alpha);
    for(int i = 0; i < length; i++) {
        uint32_t d = dest[i];
        dest[i] = d + BYTE_MUL(color, plutovg_alpha(~d));
    }
}